

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O0

RegEx * YAML::Exp::ValueInFlow(void)

{
  int iVar1;
  undefined8 in_stack_ffffffffffffff58;
  char ch;
  allocator *paVar2;
  RegEx *in_stack_ffffffffffffff60;
  allocator local_91;
  string local_90 [16];
  RegEx *in_stack_ffffffffffffff80;
  RegEx *in_stack_ffffffffffffff88;
  REGEX_OP in_stack_ffffffffffffff94;
  string *in_stack_ffffffffffffff98;
  RegEx *in_stack_ffffffffffffffa0;
  
  ch = (char)((ulong)in_stack_ffffffffffffff58 >> 0x38);
  if (ValueInFlow()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&ValueInFlow()::e);
    if (iVar1 != 0) {
      RegEx::RegEx(in_stack_ffffffffffffff60,ch);
      BlankOrBreak();
      paVar2 = &local_91;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,",]}",paVar2);
      RegEx::RegEx(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
      operator|(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      YAML::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      RegEx::~RegEx((RegEx *)0xf178a2);
      RegEx::~RegEx((RegEx *)0xf178ac);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      RegEx::~RegEx((RegEx *)0xf178cd);
      __cxa_atexit(RegEx::~RegEx,&ValueInFlow::e,&__dso_handle);
      __cxa_guard_release(&ValueInFlow()::e);
    }
  }
  return &ValueInFlow::e;
}

Assistant:

inline const RegEx& ValueInFlow() {
  static const RegEx e = RegEx(':') + (BlankOrBreak() | RegEx(",]}", REGEX_OR));
  return e;
}